

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

sexp_conflict
sexp_thread_sleep(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict timeout)

{
  sexp_conflict psVar1;
  
  (ctx->value).flonum_bits[0x60a3] = '\x01';
  if (timeout != (sexp_conflict)0x13e) {
    if ((((ulong)timeout & 1) == 0) && ((((ulong)timeout & 2) != 0 || (2 < timeout->tag - 0xb)))) {
      psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,3);
      return psVar1;
    }
    (ctx->value).opcode.dl = (sexp)0x3e;
    sexp_insert_timed(ctx,ctx,timeout);
  }
  return (sexp_conflict)&DAT_0000003e;
}

Assistant:

sexp sexp_thread_sleep (sexp ctx, sexp self, sexp_sint_t n, sexp timeout) {
  sexp_context_waitp(ctx) = 1;
  if (timeout != SEXP_TRUE) {
    sexp_assert_type(ctx, sexp_realp, SEXP_NUMBER, timeout);
    sexp_context_event(ctx) = SEXP_FALSE;
    sexp_insert_timed(ctx, ctx, timeout);
  }
  return SEXP_FALSE;
}